

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetJoin.cpp
# Opt level: O1

void __thiscall
SetJoinIRCCommand::trigger
          (SetJoinIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  Config *pCVar1;
  undefined8 uVar2;
  long *local_50 [2];
  long local_40 [2];
  
  pCVar1 = pluginInstance.setjoin_file;
  if (parameters._M_len != 0) {
    uVar2 = Jupiter::IRC::Client::getConfigSection();
    uVar2 = Jupiter::Config::operator[](pCVar1,uVar2);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,parameters._M_str,parameters._M_str + parameters._M_len);
    Jupiter::Config::set(uVar2,nick._M_len,nick._M_str,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    Jupiter::Config::write();
    Jupiter::IRC::Client::sendMessage
              (source,channel._M_len,channel._M_str,0x1f,"Your join message has been set.");
    return;
  }
  Jupiter::IRC::Client::sendMessage
            (source,channel._M_len,channel._M_str,0x2d,
             "Too few parameters! Syntax: setjoin <message>");
  return;
}

Assistant:

void SetJoinIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	if (!parameters.empty())
	{
		pluginInstance.setjoin_file[source->getConfigSection()].set(nick, static_cast<std::string>(parameters));
		pluginInstance.setjoin_file.write();
		source->sendMessage(channel, "Your join message has been set."sv);
	}
	else source->sendMessage(channel, "Too few parameters! Syntax: setjoin <message>"sv);
}